

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

vec3 dja::cross(vec3 *a,vec3 *b)

{
  vec3 vVar1;
  
  vVar1.x = a->y * b->z - b->y * a->z;
  vVar1.y = a->z * b->x - b->z * a->x;
  vVar1.z = a->x * b->y - b->x * a->y;
  return vVar1;
}

Assistant:

V3 cross(const V3& a, const V3& b) {
    return vec3(a.y * b.z - a.z * b.y,
                a.z * b.x - a.x * b.z,
                a.x * b.y - a.y * b.x);
}